

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> * __thiscall
cfd::core::Psbt::GetTxInSignaturePubkeyList
          (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__return_storage_ptr__,
          Psbt *this,uint32_t index)

{
  void *pvVar1;
  pointer __n;
  undefined8 *puVar2;
  ByteData local_a0;
  undefined1 local_88 [8];
  Pubkey pubkey;
  ByteData key;
  size_t key_index;
  wally_map_item *item;
  size_t key_max;
  wally_psbt *psbt_pointer;
  uint32_t index_local;
  Psbt *this_local;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *arr;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa91,"GetTxInSignaturePubkeyList");
  pvVar1 = this->wally_psbt_pointer_;
  __n = *(pointer *)(*(long *)((long)pvVar1 + 0x10) + 0x68 + (ulong)index * 0x110);
  ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (__return_storage_ptr__);
  ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::reserve
            (__return_storage_ptr__,(size_type)__n);
  for (key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < __n;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    puVar2 = (undefined8 *)
             (*(long *)(*(long *)((long)pvVar1 + 0x10) + 0x60 + (ulong)index * 0x110) +
             (long)key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage * 0x20);
    ByteData::ByteData((ByteData *)
                       &pubkey.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(uint8_t *)*puVar2,
                       *(uint32_t *)(puVar2 + 1));
    ByteData::ByteData(&local_a0,
                       (ByteData *)
                       &pubkey.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    Pubkey::Pubkey((Pubkey *)local_88,&local_a0);
    ByteData::~ByteData(&local_a0);
    ::std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>::
    emplace_back<cfd::core::Pubkey&>
              ((vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>> *)__return_storage_ptr__
               ,(Pubkey *)local_88);
    Pubkey::~Pubkey((Pubkey *)local_88);
    ByteData::~ByteData((ByteData *)
                        &pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Pubkey> Psbt::GetTxInSignaturePubkeyList(uint32_t index) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  size_t key_max = psbt_pointer->inputs[index].signatures.num_items;
  std::vector<Pubkey> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->inputs[index].signatures.items[key_index];
    ByteData key(item->key, static_cast<uint32_t>(item->key_len));
    Pubkey pubkey(key);
    arr.emplace_back(pubkey);
  }
  return arr;
}